

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

int __thiscall
google::protobuf::internal::ExtensionSet::GetRepeatedEnum(ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  const_reference piVar2;
  LogMessageFatal aLStack_18 [16];
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1f8,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_18,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_00259df9;
  }
  if (pEVar1->is_repeated == false) {
    GetRepeatedEnum();
LAB_00259de9:
    GetRepeatedEnum();
  }
  else {
    if ((byte)(pEVar1->type - 0x13) < 0xee) goto LAB_00259de9;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
      piVar2 = RepeatedField<int>::Get((RepeatedField<int> *)pEVar1->field_0,index);
      return *piVar2;
    }
  }
  GetRepeatedEnum();
LAB_00259df9:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

int ExtensionSet::GetRepeatedEnum(int number, int index) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  return extension->ptr.repeated_enum_value->Get(index);
}